

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_database_size.cpp
# Opt level: O1

void duckdb::PragmaDatabaseSizeFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  AttachedDatabase *this;
  pointer pcVar2;
  StringUtil *pSVar3;
  bool bVar4;
  reference pvVar5;
  Catalog *pCVar6;
  reference pvVar7;
  long lVar8;
  _func_int **pp_Var9;
  idx_t index;
  DatabaseSize ds;
  string local_118;
  string local_f8;
  LogicalType local_d8;
  string local_c0;
  unsigned_long local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  StringUtil *local_80;
  StringUtil *local_78;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  pp_Var9 = pGVar1[1]._vptr_GlobalTableFunctionState;
  if (pp_Var9 < (_func_int **)
                ((long)pGVar1[3]._vptr_GlobalTableFunctionState -
                 (long)pGVar1[2]._vptr_GlobalTableFunctionState >> 3)) {
    index = 0;
    do {
      pvVar5 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::operator[]
                         ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)
                          (pGVar1 + 2),(size_type)pp_Var9);
      this = pvVar5->_M_data;
      bVar4 = AttachedDatabase::IsSystem(this);
      if ((!bVar4) && (bVar4 = AttachedDatabase::IsTemporary(this), !bVar4)) {
        pCVar6 = AttachedDatabase::GetCatalog(this);
        pp_Var9 = pCVar6->_vptr_Catalog;
        (*pp_Var9[0x13])(&local_a0,pCVar6,context);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,0);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        pcVar2 = (this->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar2,
                   pcVar2 + (this->super_CatalogEntry).name._M_string_length);
        Value::Value(&local_70,&local_118);
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,1);
        StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_c0,local_80,0x400,(idx_t)pp_Var9);
        Value::Value(&local_70,(string *)&local_c0);
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,2);
        lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(local_98);
        Value::BIGINT(&local_70,lVar8);
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,3);
        lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(local_a0);
        Value::BIGINT(&local_70,lVar8);
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,4);
        lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(local_88);
        Value::BIGINT(&local_70,lVar8);
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,5);
        lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(local_90);
        Value::BIGINT(&local_70,lVar8);
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,6);
        pSVar3 = local_78;
        if (local_78 == (StringUtil *)0xffffffffffffffff) {
          LogicalType::LogicalType(&local_d8,SQLNULL);
          Value::Value(&local_70,&local_d8);
        }
        else {
          StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_f8,local_78,0x400,(idx_t)pp_Var9)
          ;
          Value::Value(&local_70,(string *)&local_f8);
        }
        Vector::SetValue(pvVar7,index,&local_70);
        Value::~Value(&local_70);
        if (pSVar3 == (StringUtil *)0xffffffffffffffff) {
          LogicalType::~LogicalType(&local_d8);
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,7);
        Vector::SetValue(pvVar7,index,(Value *)(pGVar1 + 5));
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,8);
        Vector::SetValue(pvVar7,index,(Value *)(pGVar1 + 0xd));
        index = index + 1;
      }
      pp_Var9 = (_func_int **)((long)pGVar1[1]._vptr_GlobalTableFunctionState + 1);
      pGVar1[1]._vptr_GlobalTableFunctionState = pp_Var9;
    } while ((pp_Var9 < (_func_int **)
                        ((long)pGVar1[3]._vptr_GlobalTableFunctionState -
                         (long)pGVar1[2]._vptr_GlobalTableFunctionState >> 3)) && (index < 0x800));
  }
  else {
    index = 0;
  }
  output->count = index;
  return;
}

Assistant:

void PragmaDatabaseSizeFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaDatabaseSizeData>();
	idx_t row = 0;
	for (; data.index < data.databases.size() && row < STANDARD_VECTOR_SIZE; data.index++) {
		auto &db = data.databases[data.index].get();
		if (db.IsSystem() || db.IsTemporary()) {
			continue;
		}
		auto ds = db.GetCatalog().GetDatabaseSize(context);
		idx_t col = 0;
		output.data[col++].SetValue(row, Value(db.GetName()));
		output.data[col++].SetValue(row, Value(StringUtil::BytesToHumanReadableString(ds.bytes)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.block_size)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.total_blocks)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.used_blocks)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.free_blocks)));
		output.data[col++].SetValue(
		    row, ds.wal_size == idx_t(-1) ? Value() : Value(StringUtil::BytesToHumanReadableString(ds.wal_size)));
		output.data[col++].SetValue(row, data.memory_usage);
		output.data[col++].SetValue(row, data.memory_limit);
		row++;
	}
	output.SetCardinality(row);
}